

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BayesianGameBase.cpp
# Opt level: O0

void __thiscall BayesianGameBase::BayesianGameBase(BayesianGameBase *this)

{
  undefined8 *in_RDI;
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  *unaff_retaddr;
  Interface_ProblemToPolicyDiscretePure *in_stack_ffffffffffffffd0;
  allocator_type *in_stack_ffffffffffffffe0;
  size_type in_stack_ffffffffffffffe8;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffff0;
  undefined8 *size;
  
  size = in_RDI;
  Interface_ProblemToPolicyDiscretePure::Interface_ProblemToPolicyDiscretePure
            (in_stack_ffffffffffffffd0);
  *in_RDI = &PTR__BayesianGameBase_00d06338;
  std::allocator<double>::allocator((allocator<double> *)0x8a6cc1);
  std::vector<double,_std::allocator<double>_>::vector
            (in_stack_fffffffffffffff0,in_stack_ffffffffffffffe8,in_stack_ffffffffffffffe0);
  std::allocator<double>::~allocator((allocator<double> *)0x8a6ce0);
  boost::numeric::ublas::
  mapped_vector<double,_boost::numeric::ublas::map_std<unsigned_long,_double,_std::allocator<std::pair<const_unsigned_long,_double>_>_>_>
  ::mapped_vector(unaff_retaddr,(size_type)size,(size_type)in_stack_fffffffffffffff0);
  *(undefined4 *)((long)in_RDI + 0x74) = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8a6d0d);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x8a6d1d);
  *(undefined1 *)(in_RDI + 0xe) = 0;
  in_RDI[0xf] = 0;
  in_RDI[0x16] = 0;
  in_RDI[0x17] = 0;
  *(undefined1 *)(in_RDI + 0x18) = 0;
  *(undefined1 *)((long)in_RDI + 0xc1) = 0;
  in_RDI[0x19] = 0;
  in_RDI[0x1a] = 0;
  in_RDI[0xc] = 0;
  in_RDI[0xd] = 0;
  return;
}

Assistant:

BayesianGameBase::BayesianGameBase()
    : 
        _m_jTypeProbs(0)
        ,_m_jTypeProbsSparse(0)
        ,_m_verboseness(0)
{
    _m_initialized=false;
    _m_nrAgents = 0;
    _m_nrJTypes = 0;
    _m_nrJA = 0;
    _m_JAoverflow = false;
    _m_JToverflow = false;
    _m_stepSizeActions = 0;
    _m_stepSizeTypes = 0;
    _m_jointToIndTypes = 0;
    _m_jointToIndTypesMap = 0;
}